

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

void d_soundfile_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  soundfile_type_setup();
  ptVar1 = gensym("soundfiler");
  p_Var2 = class_new(ptVar1,soundfiler_new,(t_method)0x0,0x40,0,A_NULL);
  soundfiler_class = p_Var2;
  ptVar1 = gensym("read");
  class_addmethod(p_Var2,soundfiler_read,ptVar1,A_GIMME);
  p_Var2 = soundfiler_class;
  ptVar1 = gensym("write");
  class_addmethod(p_Var2,soundfiler_write,ptVar1,A_GIMME);
  ptVar1 = gensym("readsf~");
  readsf_class = class_new(ptVar1,readsf_new,readsf_free,0x378,0,A_DEFFLOAT,6,0);
  class_doaddfloat(readsf_class,readsf_float);
  p_Var2 = readsf_class;
  ptVar1 = gensym("start");
  class_addmethod(p_Var2,readsf_start,ptVar1,A_NULL);
  p_Var2 = readsf_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,readsf_stop,ptVar1,A_NULL);
  p_Var2 = readsf_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,readsf_dsp,ptVar1,A_CANT);
  p_Var2 = readsf_class;
  ptVar1 = gensym("open");
  class_addmethod(p_Var2,readsf_open,ptVar1,A_GIMME);
  p_Var2 = readsf_class;
  ptVar1 = gensym("print");
  class_addmethod(p_Var2,readsf_print,ptVar1,A_NULL);
  ptVar1 = gensym("writesf~");
  p_Var2 = class_new(ptVar1,writesf_new,writesf_free,0x378,0,A_DEFFLOAT,6,0);
  writesf_class = p_Var2;
  ptVar1 = gensym("start");
  class_addmethod(p_Var2,writesf_start,ptVar1,A_NULL);
  p_Var2 = writesf_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,writesf_stop,ptVar1,A_NULL);
  p_Var2 = writesf_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,writesf_dsp,ptVar1,A_CANT,0);
  p_Var2 = writesf_class;
  ptVar1 = gensym("open");
  class_addmethod(p_Var2,writesf_open,ptVar1,A_GIMME,0);
  p_Var2 = writesf_class;
  ptVar1 = gensym("print");
  class_addmethod(p_Var2,writesf_print,ptVar1,A_NULL);
  class_domainsignalin(writesf_class,0x2e0);
  return;
}

Assistant:

void d_soundfile_setup(void)
{
    soundfile_type_setup();
    soundfiler_setup();
    readsf_setup();
    writesf_setup();
}